

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_emit(yaml_emitter_t *emitter,yaml_event_t *event)

{
  int *piVar1;
  int *piVar2;
  yaml_emitter_state_t **top;
  yaml_emitter_state_t **end;
  yaml_event_type_t yVar3;
  yaml_char_t *pyVar4;
  byte *pbVar5;
  size_t sVar6;
  yaml_emitter_state_t *pyVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  yaml_event_t *pyVar19;
  int *piVar20;
  yaml_tag_directive_t *pyVar21;
  char *pcVar22;
  long lVar23;
  byte *pbVar24;
  long lVar25;
  yaml_event_t *pyVar26;
  byte *pbVar27;
  yaml_event_t *pyVar28;
  uint uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  byte bVar36;
  int local_74;
  
  bVar36 = 0;
  if (((emitter->events).tail == (emitter->events).end) &&
     (iVar17 = yaml_queue_extend(&(emitter->events).start,&(emitter->events).head,
                                 &(emitter->events).tail,&(emitter->events).end), iVar17 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    yaml_event_delete(event);
LAB_001066df:
    iVar17 = 0;
  }
  else {
    pyVar28 = (emitter->events).tail;
    (emitter->events).tail = pyVar28 + 1;
    for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
      uVar16 = *(undefined4 *)&event->field_0x4;
      pyVar28->type = event->type;
      *(undefined4 *)&pyVar28->field_0x4 = uVar16;
      event = (yaml_event_t *)((long)event + (ulong)bVar36 * -0x10 + 8);
      pyVar28 = (yaml_event_t *)((long)pyVar28 + (ulong)bVar36 * -0x10 + 8);
    }
    pyVar28 = (emitter->events).head;
    pyVar19 = (emitter->events).tail;
    if (pyVar28 != pyVar19) {
      piVar1 = &(emitter->scalar_data).flow_plain_allowed;
      piVar2 = &(emitter->scalar_data).block_plain_allowed;
      top = &(emitter->states).top;
      end = &(emitter->states).end;
      do {
        yVar3 = pyVar28->type;
        if (yVar3 == YAML_DOCUMENT_START_EVENT) {
          lVar23 = 1;
LAB_00105340:
          lVar25 = ((long)pyVar19 - (long)pyVar28 >> 3) * 0x4ec4ec4ec4ec4ec5;
          if (lVar25 - lVar23 == 0 || lVar25 < lVar23) {
            iVar17 = 0;
            pyVar26 = pyVar28;
            while( true ) {
              yVar3 = pyVar26->type;
              if (yVar3 < (YAML_MAPPING_END_EVENT|YAML_STREAM_START_EVENT)) {
                if ((0x28aU >> (yVar3 & 0x1f) & 1) == 0) {
                  if ((0x514U >> (yVar3 & 0x1f) & 1) != 0) {
                    iVar17 = iVar17 + -1;
                  }
                }
                else {
                  iVar17 = iVar17 + 1;
                }
              }
              if (iVar17 == 0) break;
              pyVar26 = pyVar26 + 1;
              if (pyVar26 == pyVar19) goto LAB_001066bb;
            }
          }
        }
        else {
          if (yVar3 == YAML_MAPPING_START_EVENT) {
            lVar23 = 3;
            goto LAB_00105340;
          }
          if (yVar3 == YAML_SEQUENCE_START_EVENT) {
            lVar23 = 2;
            goto LAB_00105340;
          }
        }
        (emitter->anchor_data).anchor = (yaml_char_t *)0x0;
        (emitter->anchor_data).anchor_length = 0;
        (emitter->scalar_data).value = (yaml_char_t *)0x0;
        (emitter->scalar_data).length = 0;
        (emitter->tag_data).suffix = (yaml_char_t *)0x0;
        (emitter->tag_data).suffix_length = 0;
        (emitter->tag_data).handle = (yaml_char_t *)0x0;
        (emitter->tag_data).handle_length = 0;
        switch(pyVar28->type) {
        case YAML_ALIAS_EVENT:
          iVar17 = yaml_emitter_analyze_anchor(emitter,(pyVar28->data).scalar.anchor,1);
LAB_00105415:
          if (iVar17 == 0) goto LAB_001066df;
          break;
        case YAML_SCALAR_EVENT:
          pyVar4 = (pyVar28->data).scalar.anchor;
          if ((pyVar4 != (yaml_char_t *)0x0) &&
             (iVar17 = yaml_emitter_analyze_anchor(emitter,pyVar4,0), iVar17 == 0)) {
            return 0;
          }
          pyVar4 = (pyVar28->data).scalar.tag;
          if ((pyVar4 != (yaml_char_t *)0x0) &&
             (((emitter->canonical != 0 ||
               (((pyVar28->data).scalar.plain_implicit == 0 &&
                ((pyVar28->data).scalar.quoted_implicit == 0)))) &&
              (iVar17 = yaml_emitter_analyze_tag(emitter,pyVar4), iVar17 == 0)))) goto LAB_001066df;
          pbVar5 = (pyVar28->data).scalar.value;
          sVar6 = (pyVar28->data).scalar.length;
          (emitter->scalar_data).value = pbVar5;
          (emitter->scalar_data).length = sVar6;
          if (sVar6 == 0) {
            (emitter->scalar_data).multiline = 0;
            (emitter->scalar_data).flow_plain_allowed = 0;
            (emitter->scalar_data).block_plain_allowed = 1;
            (emitter->scalar_data).single_quoted_allowed = 1;
            piVar20 = &(emitter->scalar_data).block_allowed;
          }
          else {
            bVar36 = *pbVar5;
            bVar34 = false;
            bVar13 = bVar34;
            if (bVar36 == 0x2e) {
              if ((pbVar5[1] == 0x2e) && (pbVar5[2] == 0x2e)) goto LAB_001054cd;
            }
            else {
              bVar13 = false;
              if ((bVar36 == 0x2d) && ((bVar13 = bVar34, pbVar5[1] == 0x2d && (pbVar5[2] == 0x2d))))
              {
LAB_001054cd:
                bVar13 = true;
              }
            }
            lVar23 = 1;
            if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
               (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
              lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
            }
            bVar34 = true;
            if (pbVar5[lVar23] != 0x20) {
              lVar23 = 1;
              if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                 (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
              }
              if (pbVar5[lVar23] != 9) {
                lVar23 = 1;
                if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                   (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                  lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                }
                if (pbVar5[lVar23] != 0xd) {
                  lVar23 = 1;
                  if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                     (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                    lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                  }
                  if (pbVar5[lVar23] != 10) {
                    lVar23 = 1;
                    if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                       (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                      lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                    }
                    if (pbVar5[lVar23] == 0xc2) {
                      lVar23 = 2;
                      if ((((char)bVar36 < '\0') && (lVar23 = 3, (bVar36 & 0xe0) != 0xc0)) &&
                         (lVar23 = 4, (bVar36 & 0xf0) != 0xe0)) {
                        lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) * 4 + 1;
                      }
                      if (pbVar5[lVar23] == 0x85) goto LAB_00105917;
                    }
                    lVar23 = 1;
                    if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                       (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                      lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                    }
                    bVar34 = pbVar5[lVar23] == 0;
                  }
                }
              }
            }
LAB_00105917:
            pbVar27 = pbVar5 + sVar6;
            bVar35 = true;
            bVar8 = false;
            bVar10 = false;
            bVar12 = false;
            bVar32 = false;
            bVar33 = false;
            bVar31 = false;
            bVar11 = false;
            bVar30 = false;
            bVar15 = false;
            local_74 = 0;
            pbVar24 = pbVar5;
            bVar14 = bVar13;
            do {
              bVar36 = *pbVar24;
              if (pbVar24 == pbVar5) {
                if (((bVar36 - 0x21 < 0x40) &&
                    ((0x94000000a0000a77U >> ((ulong)(bVar36 - 0x21) & 0x3f) & 1) != 0)) ||
                   (bVar36 - 0x7b < 3)) {
                  bVar14 = true;
                  bVar13 = true;
                }
                if (((bVar36 == 0x3f) || (bVar36 == 0x3a)) && (bVar13 = true, bVar34)) {
                  bVar14 = true;
                }
                if (bVar36 == 0x2d && bVar34) {
                  bVar13 = true;
                  bVar14 = true;
                }
              }
              else {
                if (((bVar36 - 0x3f < 0x3f) &&
                    ((0x5000000050000001U >> ((ulong)(bVar36 - 0x3f) & 0x3f) & 1) != 0)) ||
                   (bVar36 == 0x2c)) {
                  bVar13 = true;
                }
                bVar9 = true;
                if (!bVar34) {
                  bVar9 = bVar14;
                }
                if (bVar36 != 0x3a) {
                  bVar9 = bVar14;
                }
                if ((bool)(bVar35 & bVar36 == 0x23)) {
                  bVar9 = true;
                  bVar13 = true;
                }
                bVar14 = bVar9;
                if (bVar36 == 0x3a) {
                  bVar13 = true;
                }
              }
              bVar36 = *pbVar24;
              if ((byte)(bVar36 - 0x20) < 0x5f || bVar36 == 10) {
LAB_00105a58:
                if (((char)bVar36 < '\0') && (emitter->unicode == 0)) goto LAB_00105af7;
              }
              else {
                if (bVar36 != 0xc2) {
                  if (0x29 < (byte)(bVar36 + 0x3d)) goto LAB_00105a8e;
                  goto LAB_00105a58;
                }
                if (0x9f < pbVar24[1]) goto LAB_00105a58;
LAB_00105a8e:
                if (bVar36 != 0xef) {
                  if ((bVar36 != 0xee) && ((bVar36 != 0xed || (0x9f < pbVar24[1]))))
                  goto LAB_00105af7;
                  goto LAB_00105a58;
                }
                if (pbVar24[1] == 0xbf) {
                  if ((pbVar24[2] & 0xfe) != 0xbe) goto LAB_00105a58;
                }
                else if ((pbVar24[1] != 0xbb) || (pbVar24[2] != 0xbf)) goto LAB_00105a58;
LAB_00105af7:
                bVar15 = true;
              }
              uVar29 = (uint)bVar36;
              if (bVar36 < 0xc2) {
                if ((bVar36 == 10) || (uVar29 == 0xd)) {
LAB_00105b4d:
                  local_74 = 1;
                }
              }
              else if (((uVar29 != 0xe2) && (uVar29 == 0xc2)) && (pbVar24[1] == 0x85))
              goto LAB_00105b4d;
              bVar9 = false;
              bVar35 = false;
              if (bVar36 < 0x20) {
                if ((uVar29 == 10) || (uVar29 == 0xd)) {
LAB_00105c5d:
                  if (pbVar24 == pbVar5) {
                    bVar11 = true;
                  }
                  lVar23 = 1;
                  if ((((char)bVar36 < '\0') && (lVar23 = 2, (uVar29 & 0xffffffe0) != 0xc0)) &&
                     (lVar23 = 3, (uVar29 & 0xfffffff0) != 0xe0)) {
                    lVar23 = (ulong)((uVar29 & 0xfffffff8) == 0xf0) << 2;
                  }
                  bVar35 = true;
                  if (pbVar24 + lVar23 == pbVar27) {
                    bVar33 = true;
                  }
                  if (bVar10) {
                    bVar12 = true;
                  }
                }
LAB_00105ccd:
                bVar10 = false;
              }
              else {
                if (bVar36 == 0xe2) {
LAB_00105c47:
                  bVar35 = false;
                  goto LAB_00105ccd;
                }
                bVar35 = bVar9;
                if (bVar36 == 0xc2) {
                  if (pbVar24[1] == 0x85) goto LAB_00105c5d;
                  if (uVar29 == 0xe2) goto LAB_00105c47;
                  goto LAB_00105ccd;
                }
                if (uVar29 != 0x20) goto LAB_00105ccd;
                if (pbVar24 == pbVar5) {
                  bVar30 = true;
                }
                lVar23 = 1;
                if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                   (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                  lVar23 = 0;
                }
                bVar10 = true;
                if (pbVar24 + lVar23 == pbVar27) {
                  bVar31 = true;
                }
                if (bVar8) {
                  bVar32 = true;
                }
              }
              bVar8 = bVar35;
              bVar35 = true;
              if (((0x20 < uVar29) || ((0x100002600U >> ((ulong)uVar29 & 0x3f) & 1) == 0)) &&
                 ((bVar36 == 0xe2 || ((bVar36 != 0xc2 || (pbVar24[1] != 0x85)))))) {
                bVar35 = uVar29 == 0;
              }
              lVar23 = 1;
              if ((((char)bVar36 < '\0') && (lVar23 = 2, (uVar29 & 0xffffffe0) != 0xc0)) &&
                 (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
              }
              pbVar24 = pbVar24 + lVar23;
              if (pbVar24 != pbVar27) {
                bVar36 = *pbVar24;
                lVar23 = 1;
                if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                   (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                  lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                }
                bVar34 = true;
                if (pbVar24[lVar23] != 0x20) {
                  lVar23 = 1;
                  if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                     (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                    lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                  }
                  if (pbVar24[lVar23] != 9) {
                    lVar23 = 1;
                    if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                       (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                      lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                    }
                    if (pbVar24[lVar23] != 0xd) {
                      lVar23 = 1;
                      if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                         (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                        lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                      }
                      if (pbVar24[lVar23] != 10) {
                        lVar23 = 1;
                        if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                           (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                          lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                        }
                        if (pbVar24[lVar23] == 0xc2) {
                          lVar23 = 2;
                          if ((((char)bVar36 < '\0') && (lVar23 = 3, (bVar36 & 0xe0) != 0xc0)) &&
                             (lVar23 = 4, (bVar36 & 0xf0) != 0xe0)) {
                            lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) * 4 + 1;
                          }
                          if (pbVar24[lVar23] == 0x85) goto LAB_00106227;
                        }
                        lVar23 = 1;
                        if ((((char)bVar36 < '\0') && (lVar23 = 2, (bVar36 & 0xe0) != 0xc0)) &&
                           (lVar23 = 3, (bVar36 & 0xf0) != 0xe0)) {
                          lVar23 = (ulong)((bVar36 & 0xf8) == 0xf0) << 2;
                        }
                        bVar34 = pbVar24[lVar23] == 0;
                      }
                    }
                  }
                }
              }
LAB_00106227:
            } while (pbVar24 != pbVar27);
            (emitter->scalar_data).multiline = local_74;
            (emitter->scalar_data).flow_plain_allowed = 1;
            (emitter->scalar_data).block_plain_allowed = 1;
            (emitter->scalar_data).single_quoted_allowed = 1;
            (emitter->scalar_data).block_allowed = 1;
            if (((bVar30) || (bVar11)) || ((bVar31 || (bVar33)))) {
              *piVar1 = 0;
              *piVar2 = 0;
            }
            if (bVar31) {
              (emitter->scalar_data).block_allowed = 0;
            }
            if (bVar32) {
              (emitter->scalar_data).flow_plain_allowed = 0;
              (emitter->scalar_data).block_plain_allowed = 0;
              (emitter->scalar_data).single_quoted_allowed = 0;
            }
            if (bVar12 || bVar15) {
              (emitter->scalar_data).flow_plain_allowed = 0;
              (emitter->scalar_data).block_plain_allowed = 0;
              (emitter->scalar_data).single_quoted_allowed = 0;
              (emitter->scalar_data).block_allowed = 0;
            }
            if (local_74 != 0) {
              *piVar1 = 0;
              *piVar2 = 0;
            }
            if (bVar13) {
              *piVar1 = 0;
            }
            piVar20 = piVar2;
            if (!bVar14) break;
          }
          *piVar20 = 0;
          break;
        case YAML_SEQUENCE_START_EVENT:
        case YAML_MAPPING_START_EVENT:
          pyVar4 = (pyVar28->data).scalar.anchor;
          if ((pyVar4 != (yaml_char_t *)0x0) &&
             (iVar17 = yaml_emitter_analyze_anchor(emitter,pyVar4,0), iVar17 == 0)) {
            return 0;
          }
          pyVar4 = (pyVar28->data).scalar.tag;
          if ((pyVar4 != (yaml_char_t *)0x0) &&
             ((emitter->canonical != 0 || ((pyVar28->data).sequence_start.implicit == 0)))) {
            iVar17 = yaml_emitter_analyze_tag(emitter,pyVar4);
            goto LAB_00105415;
          }
        }
        iVar17 = 0;
        if (YAML_EMIT_END_STATE < emitter->state) goto LAB_00106611;
        pyVar28 = (emitter->events).head;
        switch(emitter->state) {
        case YAML_EMIT_STREAM_START_STATE:
          if (pyVar28->type == YAML_STREAM_START_EVENT) {
            if (emitter->encoding == YAML_ANY_ENCODING) {
              emitter->encoding = (pyVar28->data).stream_start.encoding;
            }
            if (emitter->encoding == YAML_ANY_ENCODING) {
              emitter->encoding = YAML_UTF8_ENCODING;
            }
            if (emitter->best_indent - 10U < 0xfffffff8) {
              emitter->best_indent = 2;
            }
            if ((-1 < emitter->best_width) && (emitter->best_width <= emitter->best_indent * 2)) {
              emitter->best_width = 0x50;
            }
            if (emitter->best_width < 0) {
              emitter->best_width = 0x7fffffff;
            }
            if (emitter->line_break == YAML_ANY_BREAK) {
              emitter->line_break = YAML_LN_BREAK;
            }
            emitter->indent = -1;
            emitter->line = 0;
            emitter->column = 0;
            emitter->whitespace = 1;
            emitter->indention = 1;
            if (emitter->encoding != YAML_UTF8_ENCODING) {
              if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
                iVar18 = yaml_emitter_flush(emitter);
                iVar17 = 0;
                if (iVar18 == 0) goto LAB_00106611;
              }
              pyVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar4 + 1;
              *pyVar4 = 0xef;
              pyVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar4 + 1;
              *pyVar4 = 0xbb;
              pyVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar4 + 1;
              *pyVar4 = 0xbf;
            }
            emitter->state = YAML_EMIT_FIRST_DOCUMENT_START_STATE;
            iVar17 = 1;
            goto LAB_00106611;
          }
          emitter->error = YAML_EMITTER_ERROR;
          pcVar22 = "expected STREAM-START";
          break;
        case YAML_EMIT_FIRST_DOCUMENT_START_STATE:
          iVar17 = 1;
          goto LAB_001065ab;
        case YAML_EMIT_DOCUMENT_START_STATE:
          iVar17 = 0;
LAB_001065ab:
          iVar17 = yaml_emitter_emit_document_start(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_DOCUMENT_CONTENT_STATE:
          if ((*top != *end) ||
             (iVar17 = yaml_stack_extend(&(emitter->states).start,top,end), iVar17 != 0)) {
            pyVar7 = (emitter->states).top;
            (emitter->states).top = pyVar7 + 1;
            *pyVar7 = YAML_EMIT_DOCUMENT_END_STATE;
            iVar17 = yaml_emitter_emit_node(emitter,pyVar28,1,0,0,0);
            goto LAB_00106611;
          }
          emitter->error = YAML_MEMORY_ERROR;
          goto LAB_00106675;
        case YAML_EMIT_DOCUMENT_END_STATE:
          if (pyVar28->type == YAML_DOCUMENT_END_EVENT) {
            iVar18 = yaml_emitter_write_indent(emitter);
            iVar17 = 0;
            if (iVar18 != 0) {
              if ((pyVar28->data).stream_start.encoding == YAML_ANY_ENCODING) {
                iVar17 = 0;
                iVar18 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
                if ((iVar18 == 0) || (iVar18 = yaml_emitter_write_indent(emitter), iVar18 == 0))
                goto LAB_00106611;
              }
              iVar18 = yaml_emitter_flush(emitter);
              iVar17 = 0;
              if (iVar18 != 0) {
                emitter->state = YAML_EMIT_DOCUMENT_START_STATE;
                iVar17 = 1;
                pyVar21 = (emitter->tag_directives).top;
                while ((emitter->tag_directives).start != pyVar21) {
                  (emitter->tag_directives).top = pyVar21 + -1;
                  pyVar4 = pyVar21[-1].prefix;
                  yaml_free(pyVar21[-1].handle);
                  yaml_free(pyVar4);
                  pyVar21 = (emitter->tag_directives).top;
                }
              }
            }
            goto LAB_00106611;
          }
          emitter->error = YAML_EMITTER_ERROR;
          pcVar22 = "expected DOCUMENT-END";
          break;
        case YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE:
          iVar17 = 1;
          goto LAB_001065eb;
        case YAML_EMIT_FLOW_SEQUENCE_ITEM_STATE:
          iVar17 = 0;
LAB_001065eb:
          iVar17 = yaml_emitter_emit_flow_sequence_item(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE:
          iVar17 = 1;
          goto LAB_00106609;
        case YAML_EMIT_FLOW_MAPPING_KEY_STATE:
          iVar17 = 0;
LAB_00106609:
          iVar17 = yaml_emitter_emit_flow_mapping_key(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE:
          iVar17 = 1;
          goto LAB_001065fa;
        case YAML_EMIT_FLOW_MAPPING_VALUE_STATE:
          iVar17 = 0;
LAB_001065fa:
          iVar17 = yaml_emitter_emit_flow_mapping_value(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE:
          iVar17 = 1;
          goto LAB_001064f7;
        case YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE:
          iVar17 = 0;
LAB_001064f7:
          iVar17 = yaml_emitter_emit_block_sequence_item(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE:
          iVar17 = 1;
          goto LAB_001065dc;
        case YAML_EMIT_BLOCK_MAPPING_KEY_STATE:
          iVar17 = 0;
LAB_001065dc:
          iVar17 = yaml_emitter_emit_block_mapping_key(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_BLOCK_MAPPING_SIMPLE_VALUE_STATE:
          iVar17 = 1;
          goto LAB_00106529;
        case YAML_EMIT_BLOCK_MAPPING_VALUE_STATE:
          iVar17 = 0;
LAB_00106529:
          iVar17 = yaml_emitter_emit_block_mapping_value(emitter,pyVar28,iVar17);
          goto LAB_00106611;
        case YAML_EMIT_END_STATE:
          emitter->error = YAML_EMITTER_ERROR;
          pcVar22 = "expected nothing after STREAM-END";
        }
        emitter->problem = pcVar22;
LAB_00106675:
        iVar17 = 0;
LAB_00106611:
        if (iVar17 == 0) {
          return 0;
        }
        pyVar28 = (emitter->events).head;
        (emitter->events).head = pyVar28 + 1;
        yaml_event_delete(pyVar28);
        pyVar28 = (emitter->events).head;
        pyVar19 = (emitter->events).tail;
      } while (pyVar28 != pyVar19);
    }
LAB_001066bb:
    iVar17 = 1;
  }
  return iVar17;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_emit(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!ENQUEUE(emitter, emitter->events, *event)) {
        yaml_event_delete(event);
        return 0;
    }

    while (!yaml_emitter_need_more_events(emitter)) {
        if (!yaml_emitter_analyze_event(emitter, emitter->events.head))
            return 0;
        if (!yaml_emitter_state_machine(emitter, emitter->events.head))
            return 0;
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }

    return 1;
}